

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O3

void __thiscall
MutableS2ShapeIndex::UpdateFaceEdges
          (MutableS2ShapeIndex *this,int face,
          vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
          *face_edges,InteriorTracker *tracker)

{
  int iVar1;
  pointer pFVar2;
  MutableS2ShapeIndex *this_00;
  InteriorTracker *tracker_00;
  CellRelation CVar3;
  S2CellId target;
  undefined4 in_register_00000034;
  S2PaddedCell *pSVar4;
  S2PaddedCell *pSVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  byte bVar10;
  const_iterator cVar11;
  vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  clipped_edges;
  vector<MutableS2ShapeIndex::ClippedEdge,_std::allocator<MutableS2ShapeIndex::ClippedEdge>_>
  clipped_edge_storage;
  EdgeAllocator alloc;
  S2PaddedCell pcell;
  vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  local_1a8;
  long local_190;
  vector<MutableS2ShapeIndex::ClippedEdge,_std::allocator<MutableS2ShapeIndex::ClippedEdge>_>
  local_188;
  MutableS2ShapeIndex *local_170;
  InteriorTracker *local_168;
  long local_160;
  EdgeAllocator local_158;
  S2PaddedCell local_118;
  undefined1 local_b8 [16];
  VType VStack_a8;
  VType VStack_a0;
  MutableS2ShapeIndex *pMStack_98;
  R2Rect local_58;
  
  local_160 = CONCAT44(in_register_00000034,face);
  bVar10 = 0;
  lVar7 = ((long)(face_edges->
                 super__Vector_base<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(face_edges->
                 super__Vector_base<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555;
  uVar6 = (uint)lVar7;
  if ((uVar6 == 0) &&
     ((tracker->shape_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (tracker->shape_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    return;
  }
  local_188.
  super__Vector_base<MutableS2ShapeIndex::ClippedEdge,_std::allocator<MutableS2ShapeIndex::ClippedEdge>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.
  super__Vector_base<MutableS2ShapeIndex::ClippedEdge,_std::allocator<MutableS2ShapeIndex::ClippedEdge>_>
  ._M_impl.super__Vector_impl_data._M_finish = (ClippedEdge *)0x0;
  local_188.
  super__Vector_base<MutableS2ShapeIndex::ClippedEdge,_std::allocator<MutableS2ShapeIndex::ClippedEdge>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (ClippedEdge *)0x0;
  local_1a8.
  super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (ClippedEdge **)0x0;
  local_1a8.
  super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8.
  super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (ClippedEdge **)0x0;
  local_170 = this;
  local_168 = tracker;
  std::vector<MutableS2ShapeIndex::ClippedEdge,_std::allocator<MutableS2ShapeIndex::ClippedEdge>_>::
  reserve(&local_188,(long)(int)uVar6);
  std::
  vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  ::reserve(&local_1a8,(long)(int)uVar6);
  local_58.bounds_[0].bounds_.c_[0] = 1.0;
  local_58.bounds_[0].bounds_.c_[1] = 0.0;
  local_58.bounds_[1].bounds_.c_[0] = 1.0;
  local_58.bounds_[1].bounds_.c_[1] = 0.0;
  local_190 = lVar7;
  if (0 < (int)uVar6) {
    uVar8 = (ulong)(uVar6 & 0x7fffffff);
    lVar7 = 0x20;
    do {
      local_b8._8_8_ = 1.0;
      VStack_a8 = 0.0;
      VStack_a0 = 1.0;
      pMStack_98 = (MutableS2ShapeIndex *)0x0;
      pFVar2 = (face_edges->
               super__Vector_base<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_b8._0_8_ = (long)(&pFVar2->a + -3) + lVar7;
      R2Rect::FromPointPair
                ((R2Rect *)&local_118,(R2Point *)((long)(&pFVar2->a + -2) + lVar7),
                 (R2Point *)((long)&((FaceEdge *)(&pFVar2->a + -1))->shape_id + lVar7));
      VStack_a0 = local_118.bound_.bounds_[0].bounds_.c_[0];
      pMStack_98 = (MutableS2ShapeIndex *)local_118.bound_.bounds_[0].bounds_.c_[1];
      local_b8._8_8_ = local_118.id_.id_;
      VStack_a8 = local_118.padding_;
      if (local_188.
          super__Vector_base<MutableS2ShapeIndex::ClippedEdge,_std::allocator<MutableS2ShapeIndex::ClippedEdge>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_188.
          super__Vector_base<MutableS2ShapeIndex::ClippedEdge,_std::allocator<MutableS2ShapeIndex::ClippedEdge>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<MutableS2ShapeIndex::ClippedEdge,std::allocator<MutableS2ShapeIndex::ClippedEdge>>::
        _M_realloc_insert<MutableS2ShapeIndex::ClippedEdge_const&>
                  ((vector<MutableS2ShapeIndex::ClippedEdge,std::allocator<MutableS2ShapeIndex::ClippedEdge>>
                    *)&local_188,
                   (iterator)
                   local_188.
                   super__Vector_base<MutableS2ShapeIndex::ClippedEdge,_std::allocator<MutableS2ShapeIndex::ClippedEdge>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(ClippedEdge *)local_b8);
      }
      else {
        ((local_188.
          super__Vector_base<MutableS2ShapeIndex::ClippedEdge,_std::allocator<MutableS2ShapeIndex::ClippedEdge>_>
          ._M_impl.super__Vector_impl_data._M_finish)->bound).bounds_[1].bounds_.c_[1] =
             local_118.bound_.bounds_[0].bounds_.c_[1];
        ((local_188.
          super__Vector_base<MutableS2ShapeIndex::ClippedEdge,_std::allocator<MutableS2ShapeIndex::ClippedEdge>_>
          ._M_impl.super__Vector_impl_data._M_finish)->bound).bounds_[0].bounds_.c_[1] =
             local_118.padding_;
        ((local_188.
          super__Vector_base<MutableS2ShapeIndex::ClippedEdge,_std::allocator<MutableS2ShapeIndex::ClippedEdge>_>
          ._M_impl.super__Vector_impl_data._M_finish)->bound).bounds_[1].bounds_.c_[0] =
             local_118.bound_.bounds_[0].bounds_.c_[0];
        (local_188.
         super__Vector_base<MutableS2ShapeIndex::ClippedEdge,_std::allocator<MutableS2ShapeIndex::ClippedEdge>_>
         ._M_impl.super__Vector_impl_data._M_finish)->face_edge = (FaceEdge *)local_b8._0_8_;
        ((local_188.
          super__Vector_base<MutableS2ShapeIndex::ClippedEdge,_std::allocator<MutableS2ShapeIndex::ClippedEdge>_>
          ._M_impl.super__Vector_impl_data._M_finish)->bound).bounds_[0].bounds_.c_[0] =
             (VType)local_118.id_.id_;
        local_188.
        super__Vector_base<MutableS2ShapeIndex::ClippedEdge,_std::allocator<MutableS2ShapeIndex::ClippedEdge>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_188.
             super__Vector_base<MutableS2ShapeIndex::ClippedEdge,_std::allocator<MutableS2ShapeIndex::ClippedEdge>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      local_118.id_.id_ =
           (uint64)(local_188.
                    super__Vector_base<MutableS2ShapeIndex::ClippedEdge,_std::allocator<MutableS2ShapeIndex::ClippedEdge>_>
                    ._M_impl.super__Vector_impl_data._M_finish + -1);
      if (local_1a8.
          super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_1a8.
          super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<MutableS2ShapeIndex::ClippedEdge_const*,std::allocator<MutableS2ShapeIndex::ClippedEdge_const*>>
        ::_M_realloc_insert<MutableS2ShapeIndex::ClippedEdge_const*>
                  ((vector<MutableS2ShapeIndex::ClippedEdge_const*,std::allocator<MutableS2ShapeIndex::ClippedEdge_const*>>
                    *)&local_1a8,
                   (iterator)
                   local_1a8.
                   super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(ClippedEdge **)&local_118);
      }
      else {
        *local_1a8.
         super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
         ._M_impl.super__Vector_impl_data._M_finish = (ClippedEdge *)local_118.id_.id_;
        local_1a8.
        super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_1a8.
             super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      R2Rect::AddRect(&local_58,(R2Rect *)(local_b8 + 8));
      lVar7 = lVar7 + 0x60;
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
  }
  local_158.face_edges_.
  super__Vector_base<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.face_edges_.
  super__Vector_base<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.clipped_edges_.
  super__Vector_base<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>,_std::allocator<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.clipped_edges_.
  super__Vector_base<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>,_std::allocator<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_158.size_ = 0;
  local_158.clipped_edges_.
  super__Vector_base<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>,_std::allocator<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.face_edges_.
  super__Vector_base<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar8 = local_160 << 0x3d;
  S2PaddedCell::S2PaddedCell
            ((S2PaddedCell *)local_b8,(S2CellId)(uVar8 | 0x1000000000000000),kCellPadding);
  tracker_00 = local_168;
  this_00 = local_170;
  iVar1 = local_170->pending_additions_begin_;
  if (0 < (int)local_190) {
    target = S2PaddedCell::ShrinkToFit((S2PaddedCell *)local_b8,&local_58);
    if (target.id_ != local_b8._0_8_ && this_00->pending_additions_begin_ != 0) {
      local_118.id_.id_ = (uint64)&PTR__IteratorBase_002bb190;
      local_118.bound_.bounds_[0].bounds_.c_[1] = (VType)this_00;
      cVar11 = gtl::internal_btree::
               btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
               ::end((btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                      *)&this_00->cell_map_);
      local_118.bound_.bounds_[1].bounds_.c_[0] = (VType)cVar11.node;
      local_118.bound_.bounds_[1].bounds_.c_[1]._0_4_ = cVar11.position;
      local_118.padding_ = -NAN;
      local_118.bound_.bounds_[0].bounds_.c_[0] = 0.0;
      local_118.middle_.bounds_[0].bounds_.c_[0] = local_118.bound_.bounds_[1].bounds_.c_[0];
      local_118.middle_.bounds_[0].bounds_.c_[1]._0_4_ =
           local_118.bound_.bounds_[1].bounds_.c_[1]._0_4_;
      CVar3 = S2ShapeIndex::IteratorBase::LocateImpl<MutableS2ShapeIndex::Iterator>
                        (target,(Iterator *)&local_118);
      if (CVar3 == INDEXED) {
        target.id_ = (uint64)local_118.padding_;
      }
    }
    if (target.id_ != local_b8._0_8_) {
      uVar9 = ~target.id_ & target.id_ - 1;
      SkipCellRange(this_00,(S2CellId)(uVar8 | 1),(S2CellId)(target.id_ - uVar9),tracker_00,
                    &local_158,iVar1 == 0);
      S2PaddedCell::S2PaddedCell(&local_118,target,kCellPadding);
      pSVar4 = &local_118;
      pSVar5 = (S2PaddedCell *)local_b8;
      for (lVar7 = 0xc; lVar7 != 0; lVar7 = lVar7 + -1) {
        (pSVar5->id_).id_ = (pSVar4->id_).id_;
        pSVar4 = (S2PaddedCell *)((long)pSVar4 + ((ulong)bVar10 * -2 + 1) * 8);
        pSVar5 = (S2PaddedCell *)((long)pSVar5 + (ulong)bVar10 * -0x10 + 8);
      }
      UpdateEdges(this_00,(S2PaddedCell *)local_b8,&local_1a8,tracker_00,&local_158,iVar1 == 0);
      uVar9 = uVar9 + target.id_;
      SkipCellRange(this_00,(S2CellId)(uVar9 + (-uVar9 & uVar9) * 2),
                    (S2CellId)(uVar8 + 0x2000000000000001),tracker_00,&local_158,iVar1 == 0);
      goto LAB_001927f2;
    }
  }
  UpdateEdges(this_00,(S2PaddedCell *)local_b8,&local_1a8,tracker_00,&local_158,iVar1 == 0);
LAB_001927f2:
  if (local_158.face_edges_.
      super__Vector_base<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_158.face_edges_.
                    super__Vector_base<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>,_std::allocator<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>_>_>
  ::~vector(&local_158.clipped_edges_);
  if (local_1a8.
      super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a8.
                    super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_188.
      super__Vector_base<MutableS2ShapeIndex::ClippedEdge,_std::allocator<MutableS2ShapeIndex::ClippedEdge>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.
                    super__Vector_base<MutableS2ShapeIndex::ClippedEdge,_std::allocator<MutableS2ShapeIndex::ClippedEdge>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void MutableS2ShapeIndex::UpdateFaceEdges(int face,
                                          const vector<FaceEdge>& face_edges,
                                          InteriorTracker* tracker) {
  int num_edges = face_edges.size();
  if (num_edges == 0 && tracker->shape_ids().empty()) return;

  // Create the initial ClippedEdge for each FaceEdge.  Additional clipped
  // edges are created when edges are split between child cells.  We create
  // two arrays, one containing the edge data and another containing pointers
  // to those edges, so that during the recursion we only need to copy
  // pointers in order to propagate an edge to the correct child.
  vector<ClippedEdge> clipped_edge_storage;
  vector<const ClippedEdge*> clipped_edges;
  clipped_edge_storage.reserve(num_edges);
  clipped_edges.reserve(num_edges);
  R2Rect bound = R2Rect::Empty();
  for (int e = 0; e < num_edges; ++e) {
    ClippedEdge clipped;
    clipped.face_edge = &face_edges[e];
    clipped.bound = R2Rect::FromPointPair(face_edges[e].a, face_edges[e].b);
    clipped_edge_storage.push_back(clipped);
    clipped_edges.push_back(&clipped_edge_storage.back());
    bound.AddRect(clipped.bound);
  }
  // Construct the initial face cell containing all the edges, and then update
  // all the edges in the index recursively.
  EdgeAllocator alloc;
  S2CellId face_id = S2CellId::FromFace(face);
  S2PaddedCell pcell(face_id, kCellPadding);

  // "disjoint_from_index" means that the current cell being processed (and
  // all its descendants) are not already present in the index.
  bool disjoint_from_index = is_first_update();
  if (num_edges > 0) {
    S2CellId shrunk_id = ShrinkToFit(pcell, bound);
    if (shrunk_id != pcell.id()) {
      // All the edges are contained by some descendant of the face cell.  We
      // can save a lot of work by starting directly with that cell, but if we
      // are in the interior of at least one shape then we need to create
      // index entries for the cells we are skipping over.
      SkipCellRange(face_id.range_min(), shrunk_id.range_min(),
                    tracker, &alloc, disjoint_from_index);
      pcell = S2PaddedCell(shrunk_id, kCellPadding);
      UpdateEdges(pcell, &clipped_edges, tracker, &alloc, disjoint_from_index);
      SkipCellRange(shrunk_id.range_max().next(), face_id.range_max().next(),
                    tracker, &alloc, disjoint_from_index);
      return;
    }
  }
  // Otherwise (no edges, or no shrinking is possible), subdivide normally.
  UpdateEdges(pcell, &clipped_edges, tracker, &alloc, disjoint_from_index);
}